

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

void __thiscall
cmServer::WriteResponse
          (cmServer *this,cmConnection *connection,cmServerResponse *response,DebugInfo *debug)

{
  bool bVar1;
  Value *pVVar2;
  string *value;
  cmServer *this_00;
  Value obj;
  Value local_100;
  undefined1 local_d8 [32];
  Value local_b8;
  Value local_90;
  Value local_68;
  Value local_40;
  
  bVar1 = cmServerResponse::IsComplete(response);
  if (bVar1) {
    cmServerResponse::Data(&local_100,response);
    Json::Value::Value(&local_40,&response->Cookie);
    pVVar2 = Json::Value::operator[](&local_100,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_40);
    Json::Value::~Value(&local_40);
    bVar1 = cmServerResponse::IsError(response);
    value = &kREPLY_TYPE_abi_cxx11_;
    if (bVar1) {
      value = &kERROR_TYPE_abi_cxx11_;
    }
    Json::Value::Value(&local_68,value);
    pVVar2 = Json::Value::operator[](&local_100,&kTYPE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_68);
    Json::Value::~Value(&local_68);
    Json::Value::Value(&local_90,&response->Type);
    pVVar2 = Json::Value::operator[](&local_100,&kREPLY_TO_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_90);
    Json::Value::~Value(&local_90);
    this_00 = (cmServer *)response;
    bVar1 = cmServerResponse::IsError(response);
    if (bVar1) {
      cmServerResponse::ErrorMessage_abi_cxx11_((string *)local_d8,response);
      Json::Value::Value(&local_b8,(string *)local_d8);
      pVVar2 = Json::Value::operator[](&local_100,&kERROR_MESSAGE_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar2,&local_b8);
      Json::Value::~Value(&local_b8);
      this_00 = (cmServer *)local_d8._0_8_;
      if ((cmServer *)local_d8._0_8_ != (cmServer *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        this_00 = (cmServer *)local_d8._0_8_;
      }
    }
    WriteJsonObject(this_00,connection,&local_100,debug);
    Json::Value::~Value(&local_100);
    return;
  }
  __assert_fail("response.IsComplete()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                ,0x17f,
                "void cmServer::WriteResponse(cmConnection *, const cmServerResponse &, const DebugInfo *) const"
               );
}

Assistant:

void cmServer::WriteResponse(cmConnection* connection,
                             const cmServerResponse& response,
                             const DebugInfo* debug) const
{
  assert(response.IsComplete());

  Json::Value obj = response.Data();
  obj[kCOOKIE_KEY] = response.Cookie;
  obj[kTYPE_KEY] = response.IsError() ? kERROR_TYPE : kREPLY_TYPE;
  obj[kREPLY_TO_KEY] = response.Type;
  if (response.IsError()) {
    obj[kERROR_MESSAGE_KEY] = response.ErrorMessage();
  }

  this->WriteJsonObject(connection, obj, debug);
}